

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O2

void __thiscall CItems::OnRender(CItems *this)

{
  long lVar1;
  IClient *pIVar2;
  CGameClient *pCVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int i;
  uint uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  CSnapItem Item;
  CNetObj_Projectile *pCurrent;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pClient;
  if (2 < pIVar2->m_State) {
    uVar9 = 0;
    uVar4 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x1e])(pIVar2,0);
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (; uVar4 != (uint)uVar9; uVar9 = (ulong)((uint)uVar9 + 1)) {
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pClient;
      iVar5 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x20])(pIVar2,0,uVar9,&Item);
      pCurrent = (CNetObj_Projectile *)CONCAT44(extraout_var,iVar5);
      if (Item.m_Type == 4) {
        pIVar2 = ((this->super_CComponent).m_pClient)->m_pClient;
        iVar5 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x1f])
                          (pIVar2,1,4,(ulong)(uint)Item.m_ID);
        if ((CNetObj_Pickup *)CONCAT44(extraout_var_00,iVar5) != (CNetObj_Pickup *)0x0) {
          RenderPickup(this,(CNetObj_Pickup *)CONCAT44(extraout_var_00,iVar5),
                       (CNetObj_Pickup *)pCurrent);
        }
      }
      else if (Item.m_Type == 3) {
        RenderLaser(this,(CNetObj_Laser *)pCurrent);
      }
      else if (Item.m_Type == 2) {
        RenderProjectile(this,pCurrent,Item.m_ID);
      }
    }
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pClient;
      iVar5 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x20])(pIVar2,0,(ulong)uVar8,&Item);
      if (Item.m_Type == 5) {
        pIVar2 = ((this->super_CComponent).m_pClient)->m_pClient;
        iVar6 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x1f])
                          (pIVar2,1,5,(ulong)(uint)Item.m_ID);
        if ((CNetObj_Flag *)CONCAT44(extraout_var_02,iVar6) != (CNetObj_Flag *)0x0) {
          pCVar3 = (this->super_CComponent).m_pClient;
          pIVar2 = pCVar3->m_pClient;
          iVar7 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x1f])
                            (pIVar2,1,8,(ulong)(uint)(pCVar3->m_Snap).m_GameDataFlagSnapID);
          RenderFlag(this,(CNetObj_Flag *)CONCAT44(extraout_var_02,iVar6),
                     (CNetObj_Flag *)CONCAT44(extraout_var_01,iVar5),
                     (CNetObj_GameDataFlag *)CONCAT44(extraout_var_03,iVar7),
                     (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataFlag);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CItems::OnRender()
{
	if(Client()->State() < IClient::STATE_ONLINE)
		return;

	int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
	for(int i = 0; i < Num; i++)
	{
		IClient::CSnapItem Item;
		const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

		if(Item.m_Type == NETOBJTYPE_PROJECTILE)
		{
			RenderProjectile((const CNetObj_Projectile *)pData, Item.m_ID);
		}
		else if(Item.m_Type == NETOBJTYPE_PICKUP)
		{
			const void *pPrev = Client()->SnapFindItem(IClient::SNAP_PREV, Item.m_Type, Item.m_ID);
			if(pPrev)
				RenderPickup((const CNetObj_Pickup *)pPrev, (const CNetObj_Pickup *)pData);
		}
		else if(Item.m_Type == NETOBJTYPE_LASER)
		{
			RenderLaser((const CNetObj_Laser *)pData);
		}
	}

	// render flag
	for(int i = 0; i < Num; i++)
	{
		IClient::CSnapItem Item;
		const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

		if(Item.m_Type == NETOBJTYPE_FLAG)
		{
			const void *pPrev = Client()->SnapFindItem(IClient::SNAP_PREV, Item.m_Type, Item.m_ID);
			if(pPrev)
			{
				const void *pPrevGameDataFlag = Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_GAMEDATAFLAG, m_pClient->m_Snap.m_GameDataFlagSnapID);
				RenderFlag(static_cast<const CNetObj_Flag *>(pPrev), static_cast<const CNetObj_Flag *>(pData),
							static_cast<const CNetObj_GameDataFlag *>(pPrevGameDataFlag), m_pClient->m_Snap.m_pGameDataFlag);
			}
		}
	}
}